

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateCursor(GLFWimage *image,int xhot,int yhot)

{
  int iVar1;
  _GLFWcursor *cursor;
  int yhot_local;
  int xhot_local;
  GLFWimage *image_local;
  
  if (image == (GLFWimage *)0x0) {
    __assert_fail("image != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/input.c"
                  ,0x2b8,"GLFWcursor *glfwCreateCursor(const GLFWimage *, int, int)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    image_local = (GLFWimage *)0x0;
  }
  else {
    image_local = (GLFWimage *)calloc(1,0x10);
    *(_GLFWcursor **)image_local = _glfw.cursorListHead;
    _glfw.cursorListHead = (_GLFWcursor *)image_local;
    iVar1 = _glfwPlatformCreateCursor((_GLFWcursor *)image_local,image,xhot,yhot);
    if (iVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)image_local);
      image_local = (GLFWimage *)0x0;
    }
  }
  return (GLFWcursor *)image_local;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateCursor(const GLFWimage* image, int xhot, int yhot)
{
    _GLFWcursor* cursor;

    assert(image != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateCursor(cursor, image, xhot, yhot))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}